

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O0

void __thiscall GLSprite::Draw(GLSprite *this,int pass)

{
  float fVar1;
  sector_t *sec;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lightlist_t *plVar5;
  float *pfVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar9;
  double dVar8;
  TVector3<float> *local_1a0;
  uint local_188;
  uint local_184;
  lightlist_t *local_180;
  lightlist_t *local_170;
  uint local_164;
  particle_t *local_160;
  AActor *local_150;
  byte local_145;
  float local_144;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_134;
  undefined1 local_130 [8];
  FQuadDrawer qd;
  undefined1 local_118 [8];
  FVector3 v [4];
  FColormap thiscm;
  int thisll;
  int thislight;
  secplane_t *lowplane;
  secplane_t *topplane;
  undefined1 local_a0 [4];
  uint i;
  secplane_t topp;
  secplane_t bottomp;
  anon_union_4_2_12391d7c_for_PalEntry_0 aStack_44;
  bool clipping;
  uint iter;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_38;
  float local_34;
  float local_30;
  float factor;
  float dist;
  float local_24;
  float minalpha;
  float fuzzalpha;
  byte local_16;
  byte local_15;
  int rel;
  bool foglayer;
  bool additivefog;
  GLSprite *pGStack_10;
  int pass_local;
  GLSprite *this_local;
  
  if ((pass != 3) && (pass != 1)) {
    local_15 = 0;
    local_16 = 0;
    rel = pass;
    pGStack_10 = this;
    if ((this->fullbright & 1U) == 0) {
      local_144 = (float)getExtraLight();
    }
    else {
      local_144 = 0.0;
    }
    fuzzalpha = local_144;
    if (rel == 4) {
      if ((this->RenderStyle).field_0.BlendOp != '\x01') {
        FRenderState::EnableBrightmap(&gl_RenderState,false);
      }
      minalpha = *(float *)&this->RenderStyle;
      local_145 = 0;
      if (0.9999999 < this->trans) {
        bVar2 = FBoolCVar::operator_cast_to_bool(&gl_usecolorblending);
        local_145 = 0;
        if ((((bVar2) && (local_145 = 0, gl_fixedcolormap == 0)) &&
            (local_145 = 0, this->actor != (AActor *)0x0)) &&
           ((local_145 = 0, (this->fullbright & 1U) != 0 &&
            (local_145 = 0, this->gltexture != (FMaterial *)0x0)))) {
          bVar2 = FMaterial::GetTransparent(this->gltexture);
          local_145 = bVar2 ^ 0xff;
        }
      }
      gl_SetRenderStyle((FRenderStyle)minalpha,false,(bool)(local_145 & 1));
      if (this->hw_styleflags == '\x02') {
        FRenderState::AlphaFunc(&gl_RenderState,0x206,0.0);
      }
      else {
        fVar7 = FFloatCVar::operator_cast_to_float(&gl_mask_sprite_threshold);
        FRenderState::AlphaFunc(&gl_RenderState,0x206,fVar7);
      }
      if ((this->RenderStyle).field_0.BlendOp == '\b') {
        local_24 = 0.44;
        dist = 0.1;
        factor = *(float *)&(this->Colormap).FadeColor.field_0.field_0;
        bVar2 = gl_isBlack((PalEntry)factor);
        if (!bVar2) {
          local_30 = Dist2((float)ViewPos.X,(float)ViewPos.Y,this->x,this->y);
          uVar9 = extraout_XMM0_Db;
          if ((this->Colormap).FadeColor.field_0.field_0.a == '\0') {
            iVar3 = clamp<int>(0xff - this->lightlevel,0x3c,0xff);
            (this->Colormap).FadeColor.field_0.field_0.a = (BYTE)iVar3;
            uVar9 = extraout_XMM0_Db_00;
          }
          dVar8 = std::exp((double)CONCAT44(uVar9,((float)(int)-(uint)(this->Colormap).FadeColor.
                                                                      field_0.field_0.a * local_30)
                                                  / 62500.0));
          local_34 = SUB84(dVar8,0) + 0.05;
          local_24 = local_34 * local_24;
          dist = local_34 * dist;
        }
        fVar7 = FFloatCVar::operator_cast_to_float(&gl_mask_sprite_threshold);
        FRenderState::AlphaFunc(&gl_RenderState,0x206,fVar7);
        FRenderState::SetColor(&gl_RenderState,0.2,0.2,0.2,local_24,(this->Colormap).desaturation);
        local_15 = 1;
      }
      else if (((this->RenderStyle).field_0.BlendOp == '\x01') &&
              ((this->RenderStyle).field_0.DestAlpha == '\x01')) {
        local_15 = 1;
      }
    }
    if ((this->RenderStyle).field_0.BlendOp != '\b') {
      bVar2 = FBoolCVar::operator_cast_to_bool(&gl_lights);
      if ((((bVar2) && (GLRenderer->mLightCount != 0)) && (gl_fixedcolormap == 0)) &&
         ((this->fullbright & 1U) == 0)) {
        bVar2 = FBoolCVar::operator_cast_to_bool(&gl_light_sprites);
        if (bVar2) {
          local_150 = this->actor;
        }
        else {
          local_150 = (AActor *)0x0;
        }
        bVar2 = FBoolCVar::operator_cast_to_bool(&gl_light_particles);
        if (bVar2) {
          local_160 = this->particle;
        }
        else {
          local_160 = (particle_t *)0x0;
        }
        gl_SetDynSpriteLight(local_150,local_160);
      }
      gl_SetColor(this->lightlevel,(int)fuzzalpha,&this->Colormap,this->trans,false);
    }
    local_38 = (anon_union_4_2_12391d7c_for_PalEntry_0)
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this->ThingColor).field_0.field_0;
    FRenderState::SetObjectColor(&gl_RenderState,(PalEntry)local_38);
    local_3c = (anon_union_4_2_12391d7c_for_PalEntry_0)
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                &(this->Colormap).FadeColor.field_0.field_0;
    bVar2 = gl_isBlack((PalEntry)local_3c);
    if (bVar2) {
      this->foglevel = (BYTE)this->lightlevel;
    }
    if (((this->RenderStyle).field_0.Flags & 0x40) != 0) {
      PalEntry::operator=(&(this->Colormap).FadeColor,0);
      local_15 = 1;
    }
    if (((this->RenderStyle).field_0.BlendOp == '\x03') ||
       ((this->RenderStyle).field_0.BlendOp == '\x02')) {
      if (this->modelframe == (FSpriteModelFrame *)0x0) {
        iter = *(uint *)&(this->Colormap).FadeColor.field_0.field_0;
        bVar2 = gl_isBlack((PalEntry)iter);
        if (!bVar2) {
          local_16 = 1;
          FRenderState::AlphaFunc(&gl_RenderState,0x204,0.0);
        }
      }
      else {
        (this->RenderStyle).field_0.BlendOp = '\x04';
      }
    }
    if ((local_16 & 1) == 0) {
      gl_SetFog((uint)this->foglevel,(int)fuzzalpha,&this->Colormap,(bool)(local_15 & 1));
    }
    else {
      FRenderState::EnableFog(&gl_RenderState,false);
      PalEntry::PalEntry((PalEntry *)&stack0xffffffffffffffbc,0);
      FRenderState::SetFog(&gl_RenderState,(PalEntry)aStack_44,0.0);
    }
    if (this->gltexture == (FMaterial *)0x0) {
      if (this->modelframe == (FSpriteModelFrame *)0x0) {
        FRenderState::EnableTexture(&gl_RenderState,false);
      }
    }
    else {
      FRenderState::SetMaterial
                (&gl_RenderState,this->gltexture,3,this->translation,this->OverrideShader,
                 ((this->RenderStyle).field_0.Flags & 4) != 0);
    }
    if (this->lightlist == (TArray<lightlist_t,_lightlist_t> *)0x0) {
      local_164 = 1;
    }
    else {
      local_164 = TArray<lightlist_t,_lightlist_t>::Size(this->lightlist);
    }
    bVar2 = false;
    if (((this->lightlist != (TArray<lightlist_t,_lightlist_t> *)0x0) || (this->topclip != 1e+19))
       || ((NAN(this->topclip) || ((this->bottomclip != -1e+19 || (NAN(this->bottomclip))))))) {
      bVar2 = true;
      FRenderState::EnableSplit(&gl_RenderState,true);
    }
    TVector3<double>::TVector3((TVector3<double> *)&topp.negiC,0.0,0.0,-1.0);
    TVector3<double>::TVector3((TVector3<double> *)local_a0,0.0,0.0,-1.0);
    topp.normal.Z = (double)this->topclip;
    topp.D = 0.0;
    for (topplane._4_4_ = 0; topplane._4_4_ < local_164; topplane._4_4_ = topplane._4_4_ + 1) {
      if (this->lightlist == (TArray<lightlist_t,_lightlist_t> *)0x0) {
        if (bVar2) {
          FRenderState::SetSplitPlanes
                    (&gl_RenderState,(secplane_t *)local_a0,(secplane_t *)&topp.negiC);
        }
      }
      else {
        if (topplane._4_4_ == 0) {
          local_170 = (lightlist_t *)local_a0;
        }
        else {
          local_170 = TArray<lightlist_t,_lightlist_t>::operator[]
                                (this->lightlist,(ulong)topplane._4_4_);
        }
        uVar4 = TArray<lightlist_t,_lightlist_t>::Size(this->lightlist);
        if (topplane._4_4_ == uVar4 - 1) {
          local_180 = (lightlist_t *)&topp.negiC;
        }
        else {
          local_180 = TArray<lightlist_t,_lightlist_t>::operator[]
                                (this->lightlist,(ulong)(topplane._4_4_ + 1));
        }
        plVar5 = TArray<lightlist_t,_lightlist_t>::operator[](this->lightlist,(ulong)topplane._4_4_)
        ;
        if (plVar5->caster == (F3DFloor *)0x0) {
          local_184 = this->lightlevel;
        }
        else {
          plVar5 = TArray<lightlist_t,_lightlist_t>::operator[]
                             (this->lightlist,(ulong)topplane._4_4_);
          local_184 = gl_ClampLight((int)*plVar5->p_lightlevel);
        }
        if (this->actor == (AActor *)0x0) {
          local_188 = local_184;
        }
        else {
          sec = this->actor->Sector;
          AActor::InterpolatedPosition((DVector3 *)&thiscm.desaturation,this->actor,r_TicFracF);
          local_188 = gl_CheckSpriteGlow(sec,local_184,(DVector3 *)&thiscm.desaturation);
          local_188 = local_188 & 0xff;
        }
        FColormap::FColormap((FColormap *)&v[3].Y);
        v[3].Z = *(float *)&(this->Colormap).FadeColor.field_0;
        plVar5 = TArray<lightlist_t,_lightlist_t>::operator[](this->lightlist,(ulong)topplane._4_4_)
        ;
        FColormap::CopyFrom3DLight((FColormap *)&v[3].Y,plVar5);
        if ((glset.nocoloredspritelighting & 1U) != 0) {
          FColormap::Decolorize((FColormap *)&v[3].Y);
        }
        gl_SetColor(local_188,(int)fuzzalpha,(FColormap *)&v[3].Y,this->trans,false);
        if ((local_16 & 1) == 0) {
          gl_SetFog(local_184,(int)fuzzalpha,(FColormap *)&v[3].Y,(bool)(local_15 & 1));
        }
        FRenderState::SetSplitPlanes(&gl_RenderState,&local_170->plane,&local_180->plane);
      }
      if (this->modelframe == (FSpriteModelFrame *)0x0) {
        FRenderState::Apply(&gl_RenderState);
        local_1a0 = (TVector3<float> *)local_118;
        do {
          TVector3<float>::TVector3(local_1a0);
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != (TVector3<float> *)&v[3].Y);
        TFlags<ActorRenderFlag,_unsigned_int>::operator&
                  ((TFlags<ActorRenderFlag,_unsigned_int> *)&qd.field_0xc,(int)this->actor + 0xec);
        uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&qd.field_0xc);
        if (uVar4 != 0x2000) {
          CalculateVertices(this,(FVector3 *)local_118);
        }
        FQuadDrawer::FQuadDrawer((FQuadDrawer *)local_130);
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)local_118,0);
        fVar7 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)local_118,1);
        fVar1 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)local_118,2);
        FQuadDrawer::Set((FQuadDrawer *)local_130,0,fVar7,fVar1,*pfVar6,this->ul,this->vt);
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[0].Y,0);
        fVar7 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[0].Y,1);
        fVar1 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[0].Y,2);
        FQuadDrawer::Set((FQuadDrawer *)local_130,1,fVar7,fVar1,*pfVar6,this->ur,this->vt);
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[1].Y,0);
        fVar7 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[1].Y,1);
        fVar1 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[1].Y,2);
        FQuadDrawer::Set((FQuadDrawer *)local_130,2,fVar7,fVar1,*pfVar6,this->ul,this->vb);
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[2].Y,0);
        fVar7 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[2].Y,1);
        fVar1 = *pfVar6;
        pfVar6 = TVector3<float>::operator[]((TVector3<float> *)&v[2].Y,2);
        FQuadDrawer::Set((FQuadDrawer *)local_130,3,fVar7,fVar1,*pfVar6,this->ur,this->vb);
        FQuadDrawer::Render((FQuadDrawer *)local_130,5);
        if ((local_16 & 1) != 0) {
          gl_SetFog((uint)this->foglevel,(int)fuzzalpha,&this->Colormap,(bool)(local_15 & 1));
          FRenderState::SetFixedColormap(&gl_RenderState,0x10000000);
          FRenderState::BlendEquation(&gl_RenderState,0x8006);
          FRenderState::BlendFunc(&gl_RenderState,0x302,0x303);
          FRenderState::Apply(&gl_RenderState);
          FQuadDrawer::Render((FQuadDrawer *)local_130,5);
          FRenderState::SetFixedColormap(&gl_RenderState,0);
        }
      }
      else {
        gl_RenderModel(this);
      }
    }
    if (bVar2) {
      FRenderState::EnableSplit(&gl_RenderState,false);
    }
    if (rel == 4) {
      FRenderState::EnableBrightmap(&gl_RenderState,true);
      FRenderState::BlendFunc(&gl_RenderState,0x302,0x303);
      FRenderState::BlendEquation(&gl_RenderState,0x8006);
      FRenderState::SetTextureMode(&gl_RenderState,0);
    }
    PalEntry::PalEntry((PalEntry *)&local_134.field_0,0xffffffff);
    FRenderState::SetObjectColor(&gl_RenderState,(PalEntry)local_134);
    FRenderState::EnableTexture(&gl_RenderState,true);
    FRenderState::SetDynLight(&gl_RenderState,0.0,0.0,0.0);
  }
  return;
}

Assistant:

void GLSprite::Draw(int pass)
{
	if (pass == GLPASS_DECALS || pass == GLPASS_LIGHTSONLY) return;

	bool additivefog = false;
	bool foglayer = false;
	int rel = fullbright? 0 : getExtraLight();

	if (pass==GLPASS_TRANSLUCENT)
	{
		// The translucent pass requires special setup for the various modes.

		// for special render styles brightmaps would not look good - especially for subtractive.
		if (RenderStyle.BlendOp != STYLEOP_Add)
		{
			gl_RenderState.EnableBrightmap(false);
		}

		gl_SetRenderStyle(RenderStyle, false, 
			// The rest of the needed checks are done inside gl_SetRenderStyle
			trans > 1.f - FLT_EPSILON && gl_usecolorblending && gl_fixedcolormap == CM_DEFAULT && actor && 
			fullbright && gltexture && !gltexture->GetTransparent());

		if (hw_styleflags == STYLEHW_NoAlphaTest)
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
		}
		else
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
		}

		if (RenderStyle.BlendOp == STYLEOP_Shadow)
		{
			float fuzzalpha=0.44f;
			float minalpha=0.1f;

			// fog + fuzz don't work well without some fiddling with the alpha value!
			if (!gl_isBlack(Colormap.FadeColor))
			{
				float dist=Dist2(ViewPos.X, ViewPos.Y, x,y);

				if (!Colormap.FadeColor.a) Colormap.FadeColor.a=clamp<int>(255-lightlevel,60,255);

				// this value was determined by trial and error and is scale dependent!
				float factor=0.05f+exp(-Colormap.FadeColor.a*dist/62500.f);
				fuzzalpha*=factor;
				minalpha*=factor;
			}

			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
			gl_RenderState.SetColor(0.2f,0.2f,0.2f,fuzzalpha, Colormap.desaturation);
			additivefog = true;
		}
		else if (RenderStyle.BlendOp == STYLEOP_Add && RenderStyle.DestAlpha == STYLEALPHA_One)
		{
			additivefog = true;
		}
	}
	if (RenderStyle.BlendOp!=STYLEOP_Shadow)
	{
		if (gl_lights && GLRenderer->mLightCount && !gl_fixedcolormap && !fullbright)
		{
			gl_SetDynSpriteLight(gl_light_sprites ? actor : NULL, gl_light_particles ? particle : NULL);
		}
		gl_SetColor(lightlevel, rel, Colormap, trans);
	}
	gl_RenderState.SetObjectColor(ThingColor);

	if (gl_isBlack(Colormap.FadeColor)) foglevel=lightlevel;

	if (RenderStyle.Flags & STYLEF_FadeToBlack) 
	{
		Colormap.FadeColor=0;
		additivefog = true;
	}

	if (RenderStyle.BlendOp == STYLEOP_RevSub || RenderStyle.BlendOp == STYLEOP_Sub)
	{
		if (!modelframe)
		{
			// non-black fog with subtractive style needs special treatment
			if (!gl_isBlack(Colormap.FadeColor))
			{
				foglayer = true;
				// Due to the two-layer approach we need to force an alpha test that lets everything pass
				gl_RenderState.AlphaFunc(GL_GREATER, 0);
			}
		}
		else RenderStyle.BlendOp = STYLEOP_Fuzz;	// subtractive with models is not going to work.
	}

	if (!foglayer) gl_SetFog(foglevel, rel, &Colormap, additivefog);
	else
	{
		gl_RenderState.EnableFog(false);
		gl_RenderState.SetFog(0, 0);
	}

	if (gltexture) gl_RenderState.SetMaterial(gltexture, CLAMP_XY, translation, OverrideShader, !!(RenderStyle.Flags & STYLEF_RedIsAlpha));
	else if (!modelframe) gl_RenderState.EnableTexture(false);

		//gl_SetColor(lightlevel, rel, Colormap, trans);

	unsigned int iter = lightlist? lightlist->Size() : 1;
	bool clipping = false;
	if (lightlist || topclip != LARGE_VALUE || bottomclip != -LARGE_VALUE)
	{
		clipping = true;
		gl_RenderState.EnableSplit(true);
	}

	secplane_t bottomp = { { 0, 0, -1. }, bottomclip };
	secplane_t topp = { { 0, 0, -1. }, topclip };
	for (unsigned i = 0; i < iter; i++)
	{
		if (lightlist)
		{
			// set up the light slice
			secplane_t *topplane = i == 0 ? &topp : &(*lightlist)[i].plane;
			secplane_t *lowplane = i == (*lightlist).Size() - 1 ? &bottomp : &(*lightlist)[i + 1].plane;

			int thislight = (*lightlist)[i].caster != NULL ? gl_ClampLight(*(*lightlist)[i].p_lightlevel) : lightlevel;
			int thisll = actor == nullptr? thislight : (uint8_t)gl_CheckSpriteGlow(actor->Sector, thislight, actor->InterpolatedPosition(r_TicFracF));

			FColormap thiscm;
			thiscm.FadeColor = Colormap.FadeColor;
			thiscm.CopyFrom3DLight(&(*lightlist)[i]);
			if (glset.nocoloredspritelighting)
			{
				thiscm.Decolorize();
			}

			gl_SetColor(thisll, rel, thiscm, trans);
			if (!foglayer)
			{
				gl_SetFog(thislight, rel, &thiscm, additivefog);
			}
			gl_RenderState.SetSplitPlanes(*topplane, *lowplane);
		}
		else if (clipping)
		{
			gl_RenderState.SetSplitPlanes(topp, bottomp);
		}

		if (!modelframe)
		{
			gl_RenderState.Apply();

			FVector3 v[4];
			if ((actor->renderflags & RF_SPRITETYPEMASK) == RF_FLATSPRITE)
			{
			}
			else
			{
				CalculateVertices(v);
			}


			FQuadDrawer qd;
			qd.Set(0, v[0][0], v[0][1], v[0][2], ul, vt);
			qd.Set(1, v[1][0], v[1][1], v[1][2], ur, vt);
			qd.Set(2, v[2][0], v[2][1], v[2][2], ul, vb);
			qd.Set(3, v[3][0], v[3][1], v[3][2], ur, vb);
			qd.Render(GL_TRIANGLE_STRIP);

			if (foglayer)
			{
				// If we get here we know that we have colored fog and no fixed colormap.
				gl_SetFog(foglevel, rel, &Colormap, additivefog);
				gl_RenderState.SetFixedColormap(CM_FOGLAYER);
				gl_RenderState.BlendEquation(GL_FUNC_ADD);
				gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
				gl_RenderState.Apply();
				qd.Render(GL_TRIANGLE_STRIP);
				gl_RenderState.SetFixedColormap(CM_DEFAULT);
			}
		}
		else
		{
			gl_RenderModel(this);
		}
	}

	if (clipping)
	{
		gl_RenderState.EnableSplit(false);
	}

	if (pass==GLPASS_TRANSLUCENT)
	{
		gl_RenderState.EnableBrightmap(true);
		gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		gl_RenderState.BlendEquation(GL_FUNC_ADD);
		gl_RenderState.SetTextureMode(TM_MODULATE);
	}

	gl_RenderState.SetObjectColor(0xffffffff);
	gl_RenderState.EnableTexture(true);
	gl_RenderState.SetDynLight(0,0,0);
}